

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetDouble(Mem *pMem,double val)

{
  int iVar1;
  double val_local;
  Mem *pMem_local;
  
  iVar1 = sqlite3IsNaN(val);
  if (iVar1 == 0) {
    sqlite3VdbeMemRelease(pMem);
    pMem->r = val;
    pMem->flags = 8;
    pMem->type = '\x02';
  }
  else {
    sqlite3VdbeMemSetNull(pMem);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetDouble(Mem *pMem, double val){
  if( sqlite3IsNaN(val) ){
    sqlite3VdbeMemSetNull(pMem);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->r = val;
    pMem->flags = MEM_Real;
    pMem->type = SQLITE_FLOAT;
  }
}